

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderEntPush(xmlTextReaderPtr reader,xmlNodePtr value)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  int iVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE;
  char *pcVar7;
  void *pvVar8;
  
  iVar1 = reader->entMax;
  if (iVar1 < 1) {
    reader->entMax = 10;
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    reader->entTab = ppxVar2;
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      pp_Var3 = __xmlGenericError();
      UNRECOVERED_JUMPTABLE = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      pvVar8 = *ppvVar4;
      pcVar7 = "xmlMalloc failed !\n";
      uVar6 = extraout_RDX_00;
      goto LAB_001962f1;
    }
    iVar1 = reader->entMax;
  }
  iVar5 = reader->entNr;
  if (iVar5 < iVar1) {
    ppxVar2 = reader->entTab;
  }
  else {
    reader->entMax = iVar1 * 2;
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(reader->entTab,(long)(iVar1 * 2) << 3);
    reader->entTab = ppxVar2;
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      pp_Var3 = __xmlGenericError();
      UNRECOVERED_JUMPTABLE = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      pvVar8 = *ppvVar4;
      pcVar7 = "xmlRealloc failed !\n";
      uVar6 = extraout_RDX;
LAB_001962f1:
      iVar1 = (*UNRECOVERED_JUMPTABLE)(pvVar8,pcVar7,uVar6,UNRECOVERED_JUMPTABLE);
      return iVar1;
    }
    iVar5 = reader->entNr;
  }
  ppxVar2[iVar5] = value;
  reader->ent = value;
  reader->entNr = iVar5 + 1;
  return (int)ppxVar2;
}

Assistant:

static int
xmlTextReaderEntPush(xmlTextReaderPtr reader, xmlNodePtr value)
{
    if (reader->entMax <= 0) {
	reader->entMax = 10;
	reader->entTab = (xmlNodePtr *) xmlMalloc(reader->entMax *
		                                  sizeof(reader->entTab[0]));
        if (reader->entTab == NULL) {
            xmlGenericError(xmlGenericErrorContext, "xmlMalloc failed !\n");
            return (0);
        }
    }
    if (reader->entNr >= reader->entMax) {
        reader->entMax *= 2;
        reader->entTab =
            (xmlNodePtr *) xmlRealloc(reader->entTab,
                                      reader->entMax *
                                      sizeof(reader->entTab[0]));
        if (reader->entTab == NULL) {
            xmlGenericError(xmlGenericErrorContext, "xmlRealloc failed !\n");
            return (0);
        }
    }
    reader->entTab[reader->entNr] = value;
    reader->ent = value;
    return (reader->entNr++);
}